

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int str_utf8_forward(char *str,int cursor)

{
  byte bVar1;
  
  bVar1 = str[cursor];
  if (bVar1 != 0) {
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0xe0) == 0xc0) {
        if (str[(long)cursor + 1] != '\0') goto LAB_0013ee6f;
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        if (str[(long)cursor + 1] != '\0') {
          if (str[(long)cursor + 2] != '\0') {
LAB_0013ee8e:
            return cursor + 3;
          }
LAB_0013ee6f:
          return cursor + 2;
        }
      }
      else if (((bVar1 & 0xf8) == 0xf0) && (str[(long)cursor + 1] != '\0')) {
        if (str[(long)cursor + 2] != '\0') {
          if (str[(long)cursor + 3] != '\0') {
            return cursor + 4;
          }
          goto LAB_0013ee8e;
        }
        goto LAB_0013ee6f;
      }
    }
    cursor = cursor + 1;
  }
  return cursor;
}

Assistant:

int str_utf8_forward(const char *str, int cursor)
{
	const char *buf = str + cursor;
	if(!buf[0])
		return cursor;

	if((*buf&0x80) == 0x0)  /* 0xxxxxxx */
		return cursor+1;
	else if((*buf&0xE0) == 0xC0) /* 110xxxxx */
	{
		if(!buf[1]) return cursor+1;
		return cursor+2;
	}
	else  if((*buf & 0xF0) == 0xE0)	/* 1110xxxx */
	{
		if(!buf[1]) return cursor+1;
		if(!buf[2]) return cursor+2;
		return cursor+3;
	}
	else if((*buf & 0xF8) == 0xF0)	/* 11110xxx */
	{
		if(!buf[1]) return cursor+1;
		if(!buf[2]) return cursor+2;
		if(!buf[3]) return cursor+3;
		return cursor+4;
	}

	/* invalid */
	return cursor+1;
}